

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O2

int JetHead::Socket::getInterfaceAddress(char *if_name,Address *addr)

{
  int __fd;
  int iVar1;
  int iVar2;
  ifreq ifr;
  
  __fd = socket(2,2,0);
  if (__fd < 0) {
    jh_log_print(1,
                 "static int JetHead::Socket::getInterfaceAddress(const char *, Socket::Address &)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Socket.cpp"
                 ,0x24e,"socket failed");
    iVar2 = -1;
  }
  else {
    strncpy((char *)&ifr,if_name,0x10);
    ifr.ifr_ifrn.ifrn_name[0xf] = '\0';
    ifr.ifr_ifru.ifru_addr.sa_family = 2;
    iVar2 = 0;
    iVar1 = ioctl(__fd,0x8915,&ifr);
    if (iVar1 == 0) {
      (addr->mAddr).sin_family = ifr.ifr_ifru._0_2_;
      (addr->mAddr).sin_port = (short)ifr.ifr_ifru._2_6_;
      (addr->mAddr).sin_addr = (in_addr)(int)((uint6)ifr.ifr_ifru._2_6_ >> 0x10);
      *(unsigned_long *)(addr->mAddr).sin_zero = ifr.ifr_ifru.ifru_map.mem_end;
      addr->mLen = 0x10;
      ::close(__fd);
    }
    else {
      jh_log_print(2,
                   "static int JetHead::Socket::getInterfaceAddress(const char *, Socket::Address &)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Socket.cpp"
                   ,0x25b,"SIOCGIFADDR failed for %s",&ifr);
      ::close(__fd);
      iVar2 = iVar1;
    }
  }
  return iVar2;
}

Assistant:

int Socket::getInterfaceAddress( const char *if_name, Socket::Address& addr )
{
	struct ifreq ifr;
	int sockfd;

	sockfd = socket( PF_INET, SOCK_DGRAM, 0 );

	if ( sockfd < 0 )
	{
		LOG_ERR_FATAL( "socket failed" );
		return -1;
	}
	
	strncpy(ifr.ifr_name, if_name, IFNAMSIZ);
	ifr.ifr_name[IFNAMSIZ - 1] = 0;

	ifr.ifr_addr.sa_family = AF_INET;

	int res = ioctl(sockfd, SIOCGIFADDR, &ifr); 	

	if (res)
	{	
		LOG_WARN( "SIOCGIFADDR failed for %s", ifr.ifr_name );
		
		::close( sockfd );
		
		return res;
	}

	addr.setSockaddr( (struct sockaddr_in*) &(ifr.ifr_addr), 
					  sizeof(struct sockaddr_in) );
	
	LOG_INFO( "Lookup of %s got address %s", if_name, addr.getName() );
	
	::close( sockfd );
	
	return res;
}